

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.h
# Opt level: O2

void __thiscall
HashMap<TypeClass_*>::set_allocator(HashMap<TypeClass_*> *this,Allocator *newAllocator)

{
  if (this->entries == (Node **)0x0) {
    this->allocator = newAllocator;
    SmallArray<HashMap<TypeClass_*>::Node_*,_32U>::set_allocator(&this->freeList,newAllocator);
    return;
  }
  __assert_fail("entries == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/HashMap.h"
                ,0x37,"void HashMap<TypeClass *>::set_allocator(Allocator *) [Value = TypeClass *]")
  ;
}

Assistant:

void set_allocator(Allocator *newAllocator)
	{
		assert(entries == NULL);

		this->allocator = newAllocator;

		freeList.set_allocator(newAllocator);
	}